

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O0

void CB_EXPLORE::output_example(vw *all,cb_explore *data,example *ec,label *ld)

{
  byte bVar1;
  int iVar2;
  shared_data *this;
  code *pcVar3;
  cb_class *pcVar4;
  ulong uVar5;
  size_t sVar6;
  action_score *paVar7;
  int **ppiVar8;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  float fVar9;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  uint32_t i_1;
  uint32_t maxid;
  float maxprob;
  stringstream sso;
  stringstream ss;
  char temp_str [20];
  uint32_t i;
  cb_to_cs *c;
  float loss;
  undefined4 in_stack_fffffffffffffb98;
  uint32_t in_stack_fffffffffffffb9c;
  label *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  string local_3b0 [36];
  int local_38c;
  int *local_388;
  int *local_380;
  v_array<int> *local_378;
  uint local_370;
  uint local_36c;
  float local_368;
  stringstream local_358 [16];
  stringstream local_348 [192];
  stringstream *in_stack_fffffffffffffd78;
  example *in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd8f;
  vw *in_stack_fffffffffffffd90;
  stringstream local_1d0 [16];
  ostream local_1c0;
  char local_48 [20];
  uint local_34;
  long local_30;
  float local_24;
  undefined8 local_20;
  long local_18;
  undefined8 *local_8;
  
  local_24 = 0.0;
  local_30 = in_RSI + 8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  pcVar4 = GEN_CS::get_observed_cost
                     ((label *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  *(cb_class **)(local_30 + 0x50) = pcVar4;
  if (pcVar4 != (cb_class *)0x0) {
    for (local_34 = 0; uVar5 = (ulong)local_34,
        sVar6 = v_array<ACTION_SCORE::action_score>::size
                          ((v_array<ACTION_SCORE::action_score> *)(local_18 + 0x6850)),
        uVar5 < sVar6; local_34 = local_34 + 1) {
      fVar9 = CB_ALGS::get_unbiased_cost
                        ((cb_class *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                         in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                         ((v_array<ACTION_SCORE::action_score> *)(local_18 + 0x6850),(ulong)local_34
                         );
      local_24 = fVar9 * paVar7->score + local_24;
    }
  }
  this = (shared_data *)*local_8;
  bVar1 = *(byte *)(local_18 + 0x68c8);
  pcVar4 = GEN_CS::get_observed_cost
                     ((label *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
  shared_data::update(this,(bool)(bVar1 & 1),pcVar4 != (cb_class *)0x0,local_24,1.0,
                      *(size_t *)(local_18 + 0x68a0));
  std::__cxx11::stringstream::stringstream(local_1d0);
  std::__cxx11::stringstream::stringstream(local_358);
  local_368 = 0.0;
  local_36c = 0;
  for (local_370 = 0; uVar5 = (ulong)local_370,
      sVar6 = v_array<ACTION_SCORE::action_score>::size
                        ((v_array<ACTION_SCORE::action_score> *)(local_18 + 0x6850)), uVar5 < sVar6;
      local_370 = local_370 + 1) {
    paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)(local_18 + 0x6850),(ulong)local_370)
    ;
    sprintf(local_48,"%f ",SUB84((double)paVar7->score,0));
    std::operator<<(&local_1c0,local_48);
    paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                       ((v_array<ACTION_SCORE::action_score> *)(local_18 + 0x6850),(ulong)local_370)
    ;
    if (local_368 < paVar7->score) {
      paVar7 = v_array<ACTION_SCORE::action_score>::operator[]
                         ((v_array<ACTION_SCORE::action_score> *)(local_18 + 0x6850),
                          (ulong)local_370);
      local_368 = paVar7->score;
      local_36c = local_370 + 1;
    }
  }
  sprintf(local_48,"%d:%f",SUB84((double)local_368,0),(ulong)local_36c);
  std::operator<<((ostream *)(local_358 + 0x10),local_48);
  local_378 = (v_array<int> *)(local_8 + 0x6a2);
  ppiVar8 = v_array<int>::begin(local_378);
  local_380 = *ppiVar8;
  ppiVar8 = v_array<int>::end(local_378);
  local_388 = *ppiVar8;
  for (; local_380 != local_388; local_380 = local_380 + 1) {
    iVar2 = *local_380;
    pcVar3 = (code *)local_8[0x6a8];
    local_38c = iVar2;
    std::__cxx11::stringstream::str();
    (*pcVar3)(iVar2,local_3b0);
    std::__cxx11::string::~string(local_3b0);
  }
  (*(code *)PTR_test_label_00486de0)(local_20);
  print_update_cb_explore
            (in_stack_fffffffffffffd90,(bool)in_stack_fffffffffffffd8f,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78);
  std::__cxx11::stringstream::~stringstream(local_358);
  std::__cxx11::stringstream::~stringstream(local_1d0);
  return;
}

Assistant:

void output_example(vw& all, cb_explore& data, example& ec, CB::label& ld)
{
  float loss = 0.;

  cb_to_cs& c = data.cbcs;

  if ((c.known_cost = get_observed_cost(ld)) != nullptr)
    for (uint32_t i = 0; i < ec.pred.a_s.size(); i++)
      loss += get_unbiased_cost(c.known_cost, c.pred_scores, i) * ec.pred.a_s[i].score;

  all.sd->update(ec.test_only, get_observed_cost(ld) != nullptr, loss, 1.f, ec.num_features);

  char temp_str[20];
  stringstream ss, sso;
  float maxprob = 0.;
  uint32_t maxid = 0;
  for (uint32_t i = 0; i < ec.pred.a_s.size(); i++)
  {
    sprintf(temp_str, "%f ", ec.pred.a_s[i].score);
    ss << temp_str;
    if (ec.pred.a_s[i].score > maxprob)
    {
      maxprob = ec.pred.a_s[i].score;
      maxid = i + 1;
    }
  }

  sprintf(temp_str, "%d:%f", maxid, maxprob);
  sso << temp_str;

  for (int sink : all.final_prediction_sink) all.print_text(sink, ss.str(), ec.tag);

  print_update_cb_explore(all, CB::cb_label.test_label(&ld), ec, sso);
}